

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O0

void ShoveChatStr(char *str,BYTE who)

{
  bool bVar1;
  char *it;
  FString local_20;
  FString substBuff;
  char *pcStack_10;
  BYTE who_local;
  char *str_local;
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    substBuff.Chars._7_1_ = who;
    FString::FString(&local_20);
    pcStack_10 = str;
    if (((*str == '/') && ((str[1] == 'm' || (str[1] == 'M')))) &&
       ((str[2] == 'e' || (str[2] == 'E')))) {
      pcStack_10 = str + 3;
      substBuff.Chars._7_1_ = substBuff.Chars._7_1_ | 2;
    }
    Net_WriteByte('\f');
    Net_WriteByte(substBuff.Chars._7_1_);
    bVar1 = FBoolCVar::operator_cast_to_bool(&chat_substitution);
    if ((bVar1) && (bVar1 = DoSubstitution(&local_20,pcStack_10), bVar1)) {
      it = FString::operator_cast_to_char_(&local_20);
      Net_WriteString(it);
    }
    else {
      Net_WriteString(pcStack_10);
    }
    FString::~FString(&local_20);
  }
  return;
}

Assistant:

static void ShoveChatStr (const char *str, BYTE who)
{
	// Don't send empty messages
	if (str == NULL || str[0] == '\0')
		return;

	FString substBuff;

	if (str[0] == '/' &&
		(str[1] == 'm' || str[1] == 'M') &&
		(str[2] == 'e' || str[2] == 'E'))
	{ // This is a /me message
		str += 3;
		who |= 2;
	}

	Net_WriteByte (DEM_SAY);
	Net_WriteByte (who);

	if (!chat_substitution || !DoSubstitution (substBuff, str))
	{
		Net_WriteString (str);
	}
	else
	{
		Net_WriteString (substBuff);
	}
}